

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  char cVar1;
  pointer puVar2;
  pointer pcVar3;
  Option *this_00;
  size_t __n;
  pointer psVar4;
  App *pAVar5;
  size_type *psVar6;
  App *pAVar7;
  undefined8 *puVar8;
  pointer ppAVar9;
  string *psVar10;
  byte bVar11;
  int iVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  ostream *poVar14;
  pointer pbVar15;
  pointer psVar16;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var17;
  size_t sVar18;
  App *pAVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  undefined7 in_register_00000009;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  App **ppAVar22;
  size_type sVar23;
  pointer pbVar24;
  pointer ppAVar25;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  undefined7 in_register_00000081;
  size_type sVar28;
  ulong uVar29;
  byte bVar30;
  Option_p *opt;
  pointer puVar31;
  pointer ppAVar32;
  bool bVar33;
  string single_name;
  string name;
  string value;
  string commentLead;
  string commentTest;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *test_name;
  string keyChars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  value_type local_448;
  string local_420;
  string local_400;
  uint local_3e0;
  undefined4 local_3dc;
  ConfigBase *local_3d8;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  App **local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  App *local_368;
  string *local_360;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8 [2];
  size_type *local_2c8;
  size_type local_2c0;
  size_type local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  string local_288 [2];
  string local_248;
  string *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  _Any_data local_218;
  code *local_208;
  undefined8 uStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_390 = (App **)CONCAT44(local_390._4_4_,(int)CONCAT71(in_register_00000081,write_description)
                              );
  local_3dc = (undefined4)CONCAT71(in_register_00000009,default_also);
  local_360 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_3b0,this->commentChar);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_3b0,' ');
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"#;","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_388,this->commentChar);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_388,this->parentSeparatorChar);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  local_228 = __return_storage_ptr__;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_318,this->literalQuote);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_318,this->stringQuote);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_318,this->arrayStart);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_318,this->arrayEnd);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_318,this->valueDelimiter);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_318,this->arraySeparator);
  local_2f8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2f8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2f8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar31 = (app->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar31 != puVar2) {
    do {
      _Var13 = ::std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (local_2f8[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          local_2f8[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (puVar31->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (_Var13._M_current ==
          local_2f8[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2f8,
                    (value_type *)
                    (puVar31->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
      puVar31 = puVar31 + 1;
    } while (puVar31 != puVar2);
  }
  pbVar24 = local_2f8[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar21 = &local_448.field_2;
  local_448._M_dataplus._M_p = (pointer)paVar21;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(local_2f8,(const_iterator)pbVar24,&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar21) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (((byte)local_390 != '\0') &&
     (((app->configurable_ != false || (app->parent_ == (App *)0x0)) ||
      ((app->name_)._M_string_length == 0)))) {
    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
    pcVar3 = (app->description_)._M_dataplus._M_p;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar3,pcVar3 + (app->description_)._M_string_length);
    detail::fix_newlines(&local_448,&local_3b0,&local_1d8);
    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,local_448._M_dataplus._M_p,local_448._M_string_length);
    local_400._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)&local_400,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != paVar21) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_3d8 = this;
  local_368 = app;
  if (local_2f8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2f8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_220 = local_2f8[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar24 = local_2f8[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar20 = local_2f8[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar30 = 0;
    do {
      iVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(pbVar24,"Options");
      if (iVar12 == 0) {
        bVar11 = 1;
        if ((bVar30 & 1) == 0) goto LAB_0018354a;
      }
      else {
        bVar33 = pbVar24->_M_string_length == 0;
        bVar11 = 1;
        if ((bVar33 & bVar30) == 0) {
          bVar11 = bVar33 | bVar30;
LAB_0018354a:
          local_3e0 = CONCAT31(local_3e0._1_3_,bVar11);
          if ((((byte)local_390 != '\0') &&
              (iVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (pbVar24,"Options"), iVar12 != 0)) &&
             (pbVar24->_M_string_length != 0)) {
            local_448._M_dataplus._M_p._0_1_ = 10;
            poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_448,1);
            poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
            poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(pbVar24->_M_dataplus)._M_p,pbVar24->_M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," Options\n",9);
          }
          local_218._M_unused._M_object = (void *)0x0;
          local_218._8_8_ = 0;
          local_208 = (code *)0x0;
          uStack_200 = 0;
          CLI::App::get_options
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_340
                     ,app,(function<bool_(const_CLI::Option_*)> *)&local_218);
          _Var27._M_p = local_340._M_dataplus._M_p;
          puVar8 = (undefined8 *)local_340._M_string_length;
          if (local_208 != (code *)0x0) {
            (*local_208)(&local_218,&local_218,__destroy_functor);
            _Var27._M_p = local_340._M_dataplus._M_p;
            puVar8 = (undefined8 *)local_340._M_string_length;
          }
          for (; sVar23 = local_340._M_string_length,
              _Var27._M_p != (pointer)local_340._M_string_length;
              _Var27._M_p = (pointer)((long)_Var27._M_p + 8)) {
            this_00 = *(Option **)_Var27._M_p;
            local_340._M_string_length = (size_type)puVar8;
            if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
               (((__n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length,
                 __n == pbVar24->_M_string_length &&
                 ((__n == 0 ||
                  (iVar12 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                                 (pbVar24->_M_dataplus)._M_p,__n), iVar12 == 0)))) ||
                ((iVar12 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare(pbVar24,"Options"), iVar12 == 0 &&
                 ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
              pbVar15 = (this_00->lnames_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((pbVar15 ==
                   (this_00->lnames_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (pbVar15 = (this_00->snames_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pbVar15 ==
                 (this_00->snames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
                pbVar15 = (pointer)&(&this_00->pname_)[(this_00->pname_)._M_string_length == 0].
                                    _M_dataplus;
              }
              pcVar3 = (pbVar15->_M_dataplus)._M_p;
              local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_448,pcVar3,pcVar3 + pbVar15->_M_string_length);
              if (local_448._M_string_length != 0) {
                Option::reduced_results_abi_cxx11_((results_t *)&local_420,this_00);
                detail::ini_join(&local_400,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_420,local_3d8->arraySeparator,local_3d8->arrayStart,
                                 local_3d8->arrayEnd,local_3d8->stringQuote,local_3d8->literalQuote)
                ;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_420);
                if ((char)local_3dc == '\x01' && local_400._M_string_length == 0) {
                  pcVar3 = (this_00->default_str_)._M_dataplus._M_p;
                  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_420,pcVar3,
                             pcVar3 + (this_00->default_str_)._M_string_length);
                  sVar28 = local_420._M_string_length;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_420._M_dataplus._M_p != &local_420.field_2) {
                    operator_delete(local_420._M_dataplus._M_p,
                                    local_420.field_2._M_allocated_capacity + 1);
                  }
                  if (sVar28 == 0) {
                    if (this_00->expected_min_ == 0) {
                      sVar28 = 5;
                      __s = "false";
                    }
                    else {
                      sVar28 = 2;
                      __s = "\"\"";
                      if (this_00->run_callback_for_default_ != true) goto LAB_001837c2;
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_replace(&local_400,0,local_400._M_string_length,__s,sVar28);
                  }
                  else {
                    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
                    pcVar3 = (this_00->default_str_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_3d0,pcVar3,
                               pcVar3 + (this_00->default_str_)._M_string_length);
                    detail::convert_arg_for_ini
                              (&local_420,&local_3d0,local_3d8->stringQuote,local_3d8->literalQuote,
                               false);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&local_400,&local_420);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_420._M_dataplus._M_p != &local_420.field_2) {
                      operator_delete(local_420._M_dataplus._M_p,
                                      local_420.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                      operator_delete(local_3d0._M_dataplus._M_p,
                                      local_3d0.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
LAB_001837c2:
                if (local_400._M_string_length != 0) {
                  if ((this_00->fnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (this_00->fnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_248,local_400._M_dataplus._M_p,
                               local_400._M_dataplus._M_p + local_400._M_string_length);
                    Option::get_flag_value(&local_420,this_00,&local_448,&local_248);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&local_400,&local_420);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_420._M_dataplus._M_p != &local_420.field_2) {
                      operator_delete(local_420._M_dataplus._M_p,
                                      local_420.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_248._M_dataplus._M_p != &local_248.field_2) {
                      operator_delete(local_248._M_dataplus._M_p,
                                      local_248.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (((byte)local_390 != '\0') && ((this_00->description_)._M_string_length != 0))
                  {
                    local_420._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_420,1);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,local_3b0._M_dataplus._M_p,
                                         local_3b0._M_string_length);
                    local_288[0]._M_dataplus._M_p = (pointer)&local_288[0].field_2;
                    pcVar3 = (this_00->description_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_288,pcVar3,
                               pcVar3 + (this_00->description_)._M_string_length);
                    detail::fix_newlines(&local_420,&local_3b0,local_288);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,local_420._M_dataplus._M_p,
                                         local_420._M_string_length);
                    local_3d0._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(char *)&local_3d0,1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_420._M_dataplus._M_p != &local_420.field_2) {
                      operator_delete(local_420._M_dataplus._M_p,
                                      local_420.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_288[0]._M_dataplus._M_p != &local_288[0].field_2) {
                      operator_delete(local_288[0]._M_dataplus._M_p,
                                      local_288[0].field_2._M_allocated_capacity + 1);
                    }
                  }
                  clean_name_string(&local_448,&local_318);
                  ::std::operator+(&local_420,local_360,&local_448);
                  poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,local_420._M_dataplus._M_p,
                                       local_420._M_string_length);
                  local_3d0._M_dataplus._M_p._0_1_ = local_3d8->valueDelimiter;
                  poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,(char *)&local_3d0,1);
                  poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,local_400._M_dataplus._M_p,local_400._M_string_length
                                      );
                  local_3d0._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)&local_3d0,1)
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_420._M_dataplus._M_p != &local_420.field_2) {
                    operator_delete(local_420._M_dataplus._M_p,
                                    local_420.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_400._M_dataplus._M_p != &local_400.field_2) {
                  operator_delete(local_400._M_dataplus._M_p,
                                  local_400.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p,
                                local_448.field_2._M_allocated_capacity + 1);
              }
            }
            puVar8 = (undefined8 *)local_340._M_string_length;
            local_340._M_string_length = sVar23;
          }
          local_340._M_string_length = (size_type)puVar8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_340._M_dataplus._M_p,
                            local_340.field_2._M_allocated_capacity -
                            (long)local_340._M_dataplus._M_p);
          }
          pbVar20 = local_220;
          app = local_368;
          bVar11 = (byte)local_3e0;
        }
      }
      pbVar24 = pbVar24 + 1;
      bVar30 = bVar11;
    } while (pbVar24 != pbVar20);
  }
  local_448.field_2._M_allocated_capacity = 0;
  local_448.field_2._8_8_ = 0;
  local_448._M_dataplus._M_p = (pointer)0x0;
  local_448._M_string_length = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_358,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_400);
  psVar4 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar22 = local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (psVar16 = (app->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar4; psVar16 = psVar16 + 1
      ) {
    *ppAVar22 = (psVar16->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar22 = ppAVar22 + 1;
  }
  if ((code *)local_448.field_2._M_allocated_capacity != (code *)0x0) {
    _Var17 = ::std::
             __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                       ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                         )local_358.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                        (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                         )local_358.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,
                        (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_helics_external_CLI11_CLI11_hpp:8510:39)>
                         )&local_448);
    if (_Var17._M_current !=
        local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var17;
    }
    if ((code *)local_448.field_2._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_448.field_2._M_allocated_capacity)(&local_448,&local_448,3);
    }
  }
  ppAVar25 = local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar29 = (ulong)(byte)local_3dc;
    local_3e0 = (uint)(byte)local_390;
    ppAVar32 = local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar5 = *ppAVar32;
      if (((pAVar5->name_)._M_string_length == 0) &&
         (((byte)local_3dc != '\0' || (sVar18 = CLI::App::count_all(pAVar5), sVar18 != 0)))) {
        if (((byte)local_390 != '\0') && ((pAVar5->group_)._M_string_length != 0)) {
          local_448._M_dataplus._M_p._0_1_ = 10;
          poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_448,1);
          poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
          poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(pAVar5->group_)._M_dataplus._M_p,
                               (pAVar5->group_)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," Options\n",9);
        }
        pcVar3 = (local_360->_M_dataplus)._M_p;
        local_1f8[0] = local_1e8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar3,pcVar3 + local_360->_M_string_length);
        (**(local_3d8->super_Config)._vptr_Config)
                  (&local_448,local_3d8,pAVar5,uVar29,(ulong)local_3e0,(string *)local_1f8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_448._M_dataplus._M_p,local_448._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,
                          (ulong)(local_448.field_2._M_allocated_capacity + 1));
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
      }
      ppAVar9 = local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppAVar32 = ppAVar32 + 1;
    } while (ppAVar32 != ppAVar25);
    if (local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppAVar25 = local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar5 = *ppAVar25;
        sVar23 = (pAVar5->name_)._M_string_length;
        if (sVar23 != 0) {
          if ((byte)local_3dc == '\0') {
            sVar18 = CLI::App::count_all(pAVar5);
            if (sVar18 == 0) goto LAB_001842ba;
            sVar23 = (pAVar5->name_)._M_string_length;
          }
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          pcVar3 = (pAVar5->name_)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_448,pcVar3,pcVar3 + sVar23);
          clean_name_string(&local_448,&local_318);
          if ((pAVar5->configurable_ == true) &&
             (((byte)local_3dc != '\0' ||
              (pAVar19 = CLI::App::get_subcommand(local_368,pAVar5), pAVar19->parsed_ != 0)))) {
            if ((local_360->_M_string_length == 0) && (local_368->parent_ != (App *)0x0)) {
              local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
              pcVar3 = (local_368->name_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_400,pcVar3,pcVar3 + (local_368->name_)._M_string_length);
              clean_name_string(&local_400,&local_318);
              cVar1 = local_3d8->parentSeparatorChar;
              local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3d0,local_400._M_dataplus._M_p,
                         local_400._M_dataplus._M_p + local_400._M_string_length);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace_aux(&local_3d0,local_3d0._M_string_length,0,1,cVar1);
              pbVar20 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_3d0,local_448._M_dataplus._M_p,local_448._M_string_length)
              ;
              local_420._M_dataplus._M_p = (pbVar20->_M_dataplus)._M_p;
              paVar21 = &pbVar20->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_420._M_dataplus._M_p == paVar21) {
                local_420.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
                local_420.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
                local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
              }
              else {
                local_420.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
              }
              local_420._M_string_length = pbVar20->_M_string_length;
              (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
              pbVar20->_M_string_length = 0;
              (pbVar20->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_448,&local_420);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_420._M_dataplus._M_p != &local_420.field_2) {
                operator_delete(local_420._M_dataplus._M_p,
                                local_420.field_2._M_allocated_capacity + 1);
              }
              pAVar19 = local_368;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p,
                                local_3d0.field_2._M_allocated_capacity + 1);
              }
              pAVar19 = pAVar19->parent_;
              pAVar7 = pAVar19->parent_;
              while (pAVar7 != (App *)0x0) {
                local_390 = &pAVar19->parent_;
                local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
                pcVar3 = (pAVar19->name_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_420,pcVar3,pcVar3 + (pAVar19->name_)._M_string_length);
                clean_name_string(&local_420,&local_318);
                cVar1 = local_3d8->parentSeparatorChar;
                local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_340,local_420._M_dataplus._M_p,
                           local_420._M_dataplus._M_p + local_420._M_string_length);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(&local_340,local_340._M_string_length,0,1,cVar1);
                pbVar20 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&local_340,local_448._M_dataplus._M_p,local_448._M_string_length
                                   );
                local_3d0._M_dataplus._M_p = (pbVar20->_M_dataplus)._M_p;
                paVar21 = &pbVar20->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0._M_dataplus._M_p == paVar21) {
                  local_3d0.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
                  local_3d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
                  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
                }
                else {
                  local_3d0.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
                }
                local_3d0._M_string_length = pbVar20->_M_string_length;
                (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
                pbVar20->_M_string_length = 0;
                (pbVar20->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_448,&local_3d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                  operator_delete(local_3d0._M_dataplus._M_p,
                                  local_3d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_340._M_dataplus._M_p != &local_340.field_2) {
                  operator_delete(local_340._M_dataplus._M_p,
                                  local_340.field_2._M_allocated_capacity + 1);
                }
                pAVar19 = *local_390;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_420._M_dataplus._M_p != &local_420.field_2) {
                  operator_delete(local_420._M_dataplus._M_p,
                                  local_420.field_2._M_allocated_capacity + 1);
                }
                pAVar7 = pAVar19->parent_;
              }
              local_420._M_dataplus._M_p._1_7_ =
                   (undefined7)((ulong)local_420._M_dataplus._M_p >> 8);
              local_420._M_dataplus._M_p._0_1_ = 0x5b;
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_420,1);
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_448._M_dataplus._M_p,local_448._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              local_400._M_dataplus._M_p._0_1_ = 0x5b;
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (local_1a8,(char *)&local_400,1);
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(local_360->_M_dataplus)._M_p,local_360->_M_string_length
                                  );
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_448._M_dataplus._M_p,local_448._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]\n",2);
            }
            local_2a8[0] = &local_298;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"");
            (**(local_3d8->super_Config)._vptr_Config)
                      (&local_400,local_3d8,pAVar5,uVar29,(ulong)local_3e0,(string *)local_2a8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_400._M_dataplus._M_p,local_400._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1
                             );
            }
            uVar26 = local_298._M_allocated_capacity;
            _Var27._M_p = (pointer)local_2a8[0];
            if (local_2a8[0] != &local_298) {
LAB_00184296:
              operator_delete(_Var27._M_p,uVar26 + 1);
            }
          }
          else {
            ::std::operator+(&local_420,local_360,&local_448);
            pbVar20 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      _M_replace_aux(&local_420,local_420._M_string_length,0,1,
                                     local_3d8->parentSeparatorChar);
            local_2c8 = &local_2b8;
            psVar6 = (size_type *)(pbVar20->_M_dataplus)._M_p;
            paVar21 = &pbVar20->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6 == paVar21) {
              local_2b8 = paVar21->_M_allocated_capacity;
              uStack_2b0 = *(undefined4 *)((long)&pbVar20->field_2 + 8);
              uStack_2ac = *(undefined4 *)((long)&pbVar20->field_2 + 0xc);
            }
            else {
              local_2b8 = paVar21->_M_allocated_capacity;
              local_2c8 = psVar6;
            }
            local_2c0 = pbVar20->_M_string_length;
            (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
            pbVar20->_M_string_length = 0;
            (pbVar20->field_2)._M_local_buf[0] = '\0';
            (**(local_3d8->super_Config)._vptr_Config)
                      (&local_400,local_3d8,pAVar5,uVar29,(ulong)local_3e0,&local_2c8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_400._M_dataplus._M_p,local_400._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2c8 != &local_2b8) {
              operator_delete(local_2c8,local_2b8 + 1);
            }
            uVar26 = local_420.field_2._M_allocated_capacity;
            _Var27._M_p = local_420._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_420._M_dataplus._M_p != &local_420.field_2) goto LAB_00184296;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p,
                            (ulong)(local_448.field_2._M_allocated_capacity + 1));
          }
        }
LAB_001842ba:
        ppAVar25 = ppAVar25 + 1;
      } while (ppAVar25 != ppAVar9);
    }
  }
  psVar10 = local_228;
  ::std::__cxx11::stringbuf::str();
  if (local_358.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (App **)0x0) {
    operator_delete(local_358.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_358.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                             local_3b0.field_2._M_local_buf[0]) + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar10;
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description && (app->get_configurable() || app->get_parent() == nullptr || app->get_name().empty())) {
        out << commentLead << detail::fix_newlines(commentLead, app->get_description()) << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                std::string value = detail::ini_join(
                    opt->reduced_results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default()) {
                        value = "\"\"";  // empty string default value
                    }
                }

                if(!value.empty()) {

                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;

                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    return out.str();
}